

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

int __thiscall
gl4cts::StandardPageSizesTestCase::init(StandardPageSizesTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  iterator iVar1;
  mapped_type *pmVar2;
  map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
  *this_01;
  int local_24;
  
  this_00 = &this->mSupportedTargets;
  iVar1._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = 0xde0;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = 0x8c18;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = 0xde1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = 0x8c1a;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = 0x8513;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = 0x9009;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = 0x84f5;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = 0x8c2a;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = 0x8d41;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  this_01 = &this->mStandardVirtualPageSizesTable;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x100;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x100;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x100;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x100;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x100;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x80;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x80;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x40;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x40;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  pmVar2 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar2->xSize = 0x40;
  pmVar2->ySize = 0x40;
  pmVar2->zSize = 1;
  return (int)pmVar2;
}

Assistant:

void StandardPageSizesTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_1D);
	mSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);
	mSupportedTargets.push_back(GL_TEXTURE_BUFFER);
	mSupportedTargets.push_back(GL_RENDERBUFFER);

	mStandardVirtualPageSizesTable[GL_R8]			  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R8_SNORM]		  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R8I]			  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R8UI]			  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R16]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16_SNORM]	  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8_SNORM]	  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB565]		  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16F]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16I]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16UI]		  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8I]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8UI]		  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16]			  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16_SNORM]	 = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8_SNORM]	= PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB10_A2]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB10_A2UI]	 = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16F]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R32F]			  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R11F_G11F_B10F] = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB9_E5]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R32I]			  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R32UI]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16I]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16UI]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8I]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8UI]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16_SNORM]   = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16F]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RG32F]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RG32I]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RG32UI]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16I]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16UI]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA32F]		  = PageSizeStruct(64, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA32I]		  = PageSizeStruct(64, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA32UI]		  = PageSizeStruct(64, 64, 1);
}